

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall rw::FrameList_::streamWrite(FrameList_ *this,Stream *stream)

{
  Frame *pFVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int size;
  FrameStreamData buf;
  undefined8 local_68;
  float32 local_60;
  undefined8 local_5c;
  float32 local_54;
  undefined8 local_50;
  float32 local_48;
  undefined8 local_44;
  float32 local_3c;
  int32 local_38;
  undefined4 local_34;
  
  iVar5 = this->numFrames * 0x38;
  size = iVar5 + 0x10;
  if (0 < this->numFrames) {
    lVar4 = 0;
    do {
      iVar2 = PluginList::streamGetSize((PluginList *)&Frame::s_plglist,this->frames[lVar4]);
      size = size + iVar2 + 0xc;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->numFrames);
  }
  writeChunkHeader(stream,0xe,size);
  writeChunkHeader(stream,1,iVar5 + 4);
  Stream::writeU32(stream,this->numFrames);
  uVar3 = (ulong)(uint)this->numFrames;
  if (0 < this->numFrames) {
    lVar4 = 0;
    do {
      pFVar1 = this->frames[lVar4];
      local_60 = (pFVar1->matrix).right.z;
      local_68._0_4_ = (pFVar1->matrix).right.x;
      local_68._4_4_ = (pFVar1->matrix).right.y;
      local_54 = (pFVar1->matrix).up.z;
      local_5c._0_4_ = (pFVar1->matrix).up.x;
      local_5c._4_4_ = (pFVar1->matrix).up.y;
      local_48 = (pFVar1->matrix).at.z;
      local_50._0_4_ = (pFVar1->matrix).at.x;
      local_50._4_4_ = (pFVar1->matrix).at.y;
      local_3c = (pFVar1->matrix).pos.z;
      local_44._0_4_ = (pFVar1->matrix).pos.x;
      local_44._4_4_ = (pFVar1->matrix).pos.y;
      local_38 = findPointer((pFVar1->object).parent,this->frames,(int32)uVar3);
      local_34 = 0;
      Stream::write32(stream,&local_68,0x38);
      lVar4 = lVar4 + 1;
      uVar3 = (ulong)this->numFrames;
    } while (lVar4 < (long)uVar3);
    if (0 < this->numFrames) {
      lVar4 = 0;
      do {
        PluginList::streamWrite((PluginList *)&Frame::s_plglist,stream,this->frames[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->numFrames);
    }
  }
  return;
}

Assistant:

void
FrameList_::streamWrite(Stream *stream)
{
	FrameStreamData buf;

	int size = 0, structsize = 0;
	structsize = 4 + this->numFrames*sizeof(FrameStreamData);
	size += 12 + structsize;
	for(int32 i = 0; i < this->numFrames; i++)
		size += 12 + Frame::s_plglist.streamGetSize(this->frames[i]);

	writeChunkHeader(stream, ID_FRAMELIST, size);
	writeChunkHeader(stream, ID_STRUCT, structsize);
	stream->writeU32(this->numFrames);
	for(int32 i = 0; i < this->numFrames; i++){
		Frame *f = this->frames[i];
		buf.right = f->matrix.right;
		buf.up = f->matrix.up;
		buf.at = f->matrix.at;
		buf.pos = f->matrix.pos;
		buf.parent = findPointer(f->getParent(), (void**)this->frames,
		                         this->numFrames);
		buf.matflag = 0; //f->matflag;
		stream->write32(&buf, sizeof(buf));
	}
	for(int32 i = 0; i < this->numFrames; i++)
		Frame::s_plglist.streamWrite(stream, this->frames[i]);
}